

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O0

void __thiscall Kraken::KClient::KClient(KClient *this)

{
  EVP_PKEY_CTX *ctx;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  KClient *local_10;
  KClient *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->secret_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->url_,"https://api.kraken.com",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  ctx = (EVP_PKEY_CTX *)0x136967;
  std::__cxx11::string::string((string *)&this->version_,"0",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient() 
   :key_(""), secret_(""), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}